

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test7::logVariableContents(GPUShaderFP64Test7 *this,_variables *variables)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  _variable *p_Var5;
  ostream *poVar6;
  TestLog *this_00;
  MessageBuilder *this_01;
  _variable_type *data_ptr;
  string local_3c8 [32];
  char *local_3a8;
  MessageBuilder local_3a0;
  string local_220;
  uint local_200;
  _variable_type local_1fc;
  uint n_component;
  uint array_index;
  uint n_components;
  _variable_type *base_variable_type;
  _variable *variable;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
  local_1d8;
  _variables_const_iterator variables_iterator;
  uchar *traveller_ptr;
  uint n_varying;
  void *xfb_bo_data;
  stringstream local_1a8 [8];
  stringstream log_sstream;
  ostream local_198;
  long local_20;
  Functions *gl;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  gl = (Functions *)variables;
  variables_local = (_variables *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar2);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"Test variable values as retrieved from geometry shader:\n");
  p_Var5 = (_variable *)(**(code **)(local_20 + 0xcf8))(0x8c8e,35000);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2807);
  traveller_ptr._4_4_ = 0;
  variables_iterator._M_current = p_Var5;
  local_1d8._M_current =
       (_variable *)
       std::
       vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
       ::begin((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                *)gl);
  while( true ) {
    variable = (_variable *)
               std::
               vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ::end((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                      *)gl);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1d8,
                       (__normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
                        *)&variable);
    if (!bVar1) break;
    base_variable_type =
         (_variable_type *)
         __gnu_cxx::
         __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
         ::operator*(&local_1d8);
    array_index = Utils::getBaseVariableType(((reference)base_variable_type)->type);
    _n_components = &array_index;
    n_component = Utils::getNumberOfComponentsForVariableType(base_variable_type[2]);
    for (local_1fc = VARIABLE_TYPE_BOOL; local_1fc < base_variable_type[1];
        local_1fc = local_1fc + VARIABLE_TYPE_BVEC2) {
      data_ptr = base_variable_type;
      poVar6 = std::operator<<(&local_198,"gs_variable");
      std::ostream::operator<<(poVar6,traveller_ptr._4_4_);
      if (VARIABLE_TYPE_BVEC2 < base_variable_type[1]) {
        poVar6 = std::operator<<(&local_198,"[");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1fc);
        std::operator<<(poVar6,"]");
      }
      std::operator<<(&local_198,": (");
      for (local_200 = 0; local_200 < n_component; local_200 = local_200 + 1) {
        Utils::getStringForVariableTypeValue_abi_cxx11_
                  (&local_220,(Utils *)(ulong)*_n_components,
                   (_variable_type)variables_iterator._M_current,(uchar *)data_ptr);
        std::operator<<(&local_198,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        data_ptr = (_variable_type *)(ulong)(n_component - 1);
        if (local_200 != n_component - 1) {
          std::operator<<(&local_198,", ");
        }
        variables_iterator._M_current = (_variable *)&(variables_iterator._M_current)->type;
      }
      std::operator<<(&local_198,")\n");
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
    ::operator++(&local_1d8);
    traveller_ptr._4_4_ = traveller_ptr._4_4_ + 1;
  }
  (**(code **)(local_20 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2832);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_3a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::stringstream::str();
  local_3a8 = (char *)std::__cxx11::string::c_str();
  this_01 = tcu::MessageBuilder::operator<<(&local_3a0,&local_3a8);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(local_3c8);
  tcu::MessageBuilder::~MessageBuilder(&local_3a0);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void GPUShaderFP64Test7::logVariableContents(const _variables& variables)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	std::stringstream	 log_sstream;

	log_sstream << "Test variable values as retrieved from geometry shader:\n";

	/* Map the XFB BO contents into process space */
	const void* xfb_bo_data = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

	/* Read the variable contents. We only care about the set of varyings emitted
	 * for first vertex in the geometry shader */
	unsigned int		 n_varying	 = 0;
	const unsigned char* traveller_ptr = (const unsigned char*)xfb_bo_data;

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator, ++n_varying)
	{
		const _variable&			 variable			= *variables_iterator;
		const Utils::_variable_type& base_variable_type = Utils::getBaseVariableType(variable.type);
		const unsigned int			 n_components		= Utils::getNumberOfComponentsForVariableType(variable.type);

		for (unsigned int array_index = 0; array_index < variable.array_size; ++array_index)
		{
			log_sstream << "gs_variable" << n_varying;

			if (variable.array_size > 1)
			{
				log_sstream << "[" << array_index << "]";
			}

			log_sstream << ": (";

			for (unsigned int n_component = 0; n_component < n_components; ++n_component)
			{
				log_sstream << Utils::getStringForVariableTypeValue(base_variable_type, traveller_ptr);

				if (n_component != (n_components - 1))
				{
					log_sstream << ", ";
				}

				traveller_ptr += sizeof(double);
			}

			log_sstream << ")\n";
		} /* for (all array indices) */
	}	 /* for (all variables) */

	/* Unmap the BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/* Pass the logged stream into the framework */
	m_testCtx.getLog() << tcu::TestLog::Message << log_sstream.str().c_str() << tcu::TestLog::EndMessage;
}